

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

void luaS_init(lua_State *L)

{
  global_State *pgVar1;
  TString **vect;
  TString *pTVar2;
  long lVar3;
  TString *(*papTVar4) [2];
  long lVar5;
  
  pgVar1 = L->l_G;
  vect = (TString **)luaM_malloc_(L,0x400,0);
  (pgVar1->strt).hash = vect;
  tablerehash(vect,0,0x80);
  (pgVar1->strt).size = 0x80;
  pTVar2 = internshrstr(L,"not enough memory",0x11);
  pgVar1->memerrmsg = pTVar2;
  luaC_fix(L,(GCObject *)pTVar2);
  pTVar2 = pgVar1->memerrmsg;
  papTVar4 = pgVar1->strcache;
  for (lVar5 = 0; lVar5 != 0x35; lVar5 = lVar5 + 1) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      (*papTVar4)[lVar3] = pTVar2;
    }
    papTVar4 = papTVar4 + 1;
  }
  return;
}

Assistant:

void luaS_init (lua_State *L) {
  global_State *g = G(L);
  int i, j;
  stringtable *tb = &G(L)->strt;
  tb->hash = luaM_newvector(L, MINSTRTABSIZE, TString*);
  tablerehash(tb->hash, 0, MINSTRTABSIZE);  /* clear array */
  tb->size = MINSTRTABSIZE;
  /* pre-create memory-error message */
  g->memerrmsg = luaS_newliteral(L, MEMERRMSG);
  luaC_fix(L, obj2gco(g->memerrmsg));  /* it should never be collected */
  for (i = 0; i < STRCACHE_N; i++)  /* fill cache with valid strings */
    for (j = 0; j < STRCACHE_M; j++)
      g->strcache[i][j] = g->memerrmsg;
}